

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_add_output_at(wally_tx *tx,uint32_t index,wally_tx_output *output)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  ulong in_RAX;
  wally_tx_output *pwVar4;
  ulong uVar5;
  uint64_t total;
  ulong local_38;
  
  bVar1 = output->features;
  local_38 = in_RAX;
  _Var2 = is_valid_tx(tx);
  iVar3 = -2;
  if ((_Var2) && (uVar5 = (ulong)index, uVar5 <= tx->num_outputs)) {
    if ((bVar1 & 1) == 0) {
      if (output == (wally_tx_output *)0x0) {
        return -2;
      }
      if ((output->script != (uchar *)0x0) == (output->script_len == 0)) {
        return -2;
      }
      if (2100000000000000 < output->satoshi) {
        return -2;
      }
      iVar3 = wally_tx_get_total_output_satoshi(tx,&local_38);
      if (iVar3 != 0) {
        return -2;
      }
      if (2100000000000000 < output->satoshi + local_38 || CARRY8(output->satoshi,local_38)) {
        return -2;
      }
    }
    else {
      if (output == (wally_tx_output *)0x0) {
        return -2;
      }
      if ((output->script != (uchar *)0x0) == (output->script_len == 0)) {
        return -2;
      }
    }
    if (tx->outputs_allocation_len <= tx->num_outputs) {
      pwVar4 = (wally_tx_output *)
               realloc_array(tx->outputs,tx->outputs_allocation_len,tx->num_outputs + 1,0x70);
      if (pwVar4 == (wally_tx_output *)0x0) {
        return -3;
      }
      clear_and_free(tx->outputs,tx->num_outputs * 0x70);
      tx->outputs = pwVar4;
      tx->outputs_allocation_len = tx->outputs_allocation_len + 1;
    }
    memmove(tx->outputs + uVar5 + 1,tx->outputs + uVar5,(tx->num_outputs - uVar5) * 0x70);
    iVar3 = wally_tx_output_clone(output,tx->outputs + uVar5);
    if (iVar3 == 0) {
      tx->num_outputs = tx->num_outputs + 1;
      iVar3 = 0;
    }
    else {
      memmove(tx->outputs + uVar5,tx->outputs + uVar5 + 1,(tx->num_outputs - uVar5) * 0x70);
    }
  }
  return iVar3;
}

Assistant:

int wally_tx_add_output_at(struct wally_tx *tx, uint32_t index,
                           const struct wally_tx_output *output)
{
    uint64_t total;
    int ret;
    const bool is_elements = output->features & WALLY_TX_IS_ELEMENTS;

    if (!is_valid_tx(tx) || index > tx->num_outputs)
        return WALLY_EINVAL;

    if (!is_elements) {
        if (!is_valid_tx_output(output) ||
            wally_tx_get_total_output_satoshi(tx, &total) != WALLY_OK ||
            total + output->satoshi < total || total + output->satoshi > WALLY_SATOSHI_MAX)
            return WALLY_EINVAL;
    } else if (!is_valid_elements_tx_output(output))
        return WALLY_EINVAL;

    if (tx->num_outputs >= tx->outputs_allocation_len) {
        /* Expand the outputs array */
        struct wally_tx_output *p;
        p = realloc_array(tx->outputs, tx->outputs_allocation_len,
                          tx->num_outputs + 1, sizeof(*tx->outputs));
        if (!p)
            return WALLY_ENOMEM;

        clear_and_free(tx->outputs, tx->num_outputs * sizeof(*tx->outputs));
        tx->outputs = p;
        tx->outputs_allocation_len += 1;
    }

    memmove(tx->outputs + index + 1, tx->outputs + index,
            (tx->num_outputs - index) * sizeof(*output));

    if ((ret = wally_tx_output_clone(output, tx->outputs + index)) != WALLY_OK) {
        memmove(tx->outputs + index, tx->outputs + index + 1,
                (tx->num_outputs - index) * sizeof(*output)); /* Undo */
        return ret;
    }

    tx->num_outputs += 1;
    return WALLY_OK;
}